

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

void pce_defchr(int *ip)

{
  char last_char;
  int iVar1;
  int local_40;
  int i;
  int size;
  uint data [8];
  int *ip_local;
  
  data_loccnt = loccnt;
  data_size = 3;
  data_level = 3;
  if (lablptr != (t_symbol *)0x0) {
    labldef(loccnt,1);
    iVar1 = evaluate(ip,',');
    if (iVar1 == 0) {
      return;
    }
    if (0x7eff < value) {
      error("Incorrect VRAM address!");
      return;
    }
    lablptr->vram = value;
    iVar1 = evaluate(ip,',');
    if (iVar1 == 0) {
      return;
    }
    if (0xf < value) {
      error("Incorrect palette index!");
      return;
    }
    lablptr->pal = value;
  }
  local_40 = 0;
  while( true ) {
    if (7 < local_40) {
      iVar1 = pce_pack_8x8_tile(buffer,&i,0,2);
      putbuffer(buffer,iVar1);
      if (pass == 1) {
        println();
      }
      return;
    }
    last_char = ';';
    if (local_40 < 7) {
      last_char = ',';
    }
    iVar1 = evaluate(ip,last_char);
    if (iVar1 == 0) break;
    (&i)[local_40] = value;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void
pce_defchr(int *ip)
{
	unsigned int data[8];
	int size;
	int i;

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 3;
	data_level  = 3;

	/* check if there's a label */
	if (lablptr) {
		/* define label */
		labldef(loccnt, 1);

		/* get the VRAM address */
		if (!evaluate(ip, ','))
			return;
		if (value >= 0x7F00) {
			error("Incorrect VRAM address!");
			return;
		}
		lablptr->vram = value;
	
		/* get the default palette */
		if (!evaluate(ip, ','))
			return;
		if (value > 0x0F) {
			error("Incorrect palette index!");
			return;
		}
		lablptr->pal = value;
	}

	/* get tile data */
	for (i = 0; i < 8; i++) {
		/* get value */
		if (!evaluate(ip, (i < 7) ? ',' : ';'))
			return;

		/* store value */
		data[i] = value;
	}

	/* encode tile */
	size = pce_pack_8x8_tile(buffer, data, 0, PACKED_TILE);

	/* store tile */
	putbuffer(buffer, size);

	/* output line */
	if (pass == LAST_PASS)
		println();
}